

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_mkdir(char *_dname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  _func_int_void_ptr_char_ptr *p_Var3;
  undefined8 uVar4;
  DirHandle *pDVar5;
  int iVar6;
  PHYSFS_ErrorCode PVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  PHYSFS_Stat *pPVar12;
  undefined8 *puVar13;
  undefined1 *ptr;
  ulong uVar14;
  undefined8 uStack_70;
  PHYSFS_Stat local_68;
  char *local_40;
  char *local_38;
  
  pPVar12 = &local_68;
  if (_dname == (char *)0x0) {
    puVar13 = &uStack_70;
    uStack_70 = 9;
  }
  else {
    uStack_70 = 0x10814a;
    sVar9 = strlen(_dname);
    if (sVar9 + 1 < 0x100) {
      pPVar12 = (PHYSFS_Stat *)((long)&local_68 - (sVar9 + 0x18 & 0xfffffffffffffff0));
      ptr = (undefined1 *)pPVar12;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)((long)pPVar12 + -8) = 0x108178;
    pcVar10 = (char *)__PHYSFS_initSmallAlloc(ptr,sVar9 + 1);
    if (pcVar10 != (char *)0x0) {
      local_38 = pcVar10;
      *(undefined8 *)((long)pPVar12 + -8) = 0x108193;
      iVar6 = sanitizePlatformIndependentPath(_dname,pcVar10);
      if (iVar6 == 0) {
        uVar8 = 0;
      }
      else {
        *(undefined8 *)((long)pPVar12 + -8) = 0x1081a7;
        __PHYSFS_platformGrabMutex(stateLock);
        pDVar5 = writeDir;
        local_40 = pcVar10;
        if (writeDir == (DirHandle *)0x0) {
          *(undefined8 *)((long)pPVar12 + -8) = 0xd;
          uVar4 = *(undefined8 *)((long)pPVar12 + -8);
          *(undefined8 *)((long)pPVar12 + -8) = 0x10827a;
          PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
        }
        else {
          *(undefined8 *)((long)pPVar12 + -8) = 1;
          uVar14 = *(ulong *)((long)pPVar12 + -8);
          *(undefined8 *)((long)pPVar12 + -8) = 0x1081ce;
          iVar6 = verifyPath(writeDir,&local_38,(int)uVar14);
          pcVar10 = local_38;
          pcVar11 = local_38;
          if (iVar6 != 0) {
            do {
              *(undefined8 *)((long)pPVar12 + -8) = 0x2f;
              uVar4 = *(undefined8 *)((long)pPVar12 + -8);
              *(undefined8 *)((long)pPVar12 + -8) = 0x1081e8;
              pcVar11 = strchr(pcVar11,(int)uVar4);
              if (pcVar11 != (char *)0x0) {
                *pcVar11 = '\0';
              }
              if ((int)uVar14 == 0) {
LAB_0010823a:
                pvVar1 = pDVar5->opaque;
                p_Var3 = pDVar5->funcs->mkdir;
                *(undefined8 *)((long)pPVar12 + -8) = 0x108247;
                uVar8 = (*p_Var3)(pvVar1,pcVar10);
                uVar14 = 0;
              }
              else {
                pvVar1 = pDVar5->opaque;
                p_Var2 = pDVar5->funcs->stat;
                *(undefined8 *)((long)pPVar12 + -8) = 0x10820b;
                iVar6 = (*p_Var2)(pvVar1,pcVar10,&local_68);
                if (iVar6 == 0) {
                  *(undefined8 *)((long)pPVar12 + -8) = 0x108216;
                  PVar7 = currentErrorCode();
                  uVar14 = uVar14 & 0xffffffff;
                  if (PVar7 == PHYSFS_ERR_NOT_FOUND) {
                    uVar14 = 0;
                  }
                }
                if ((int)uVar14 == 0) goto LAB_0010823a;
                uVar8 = (uint)(iVar6 != 0 && local_68.filetype == PHYSFS_FILETYPE_DIRECTORY);
              }
              if ((pcVar11 == (char *)0x0) || (uVar8 == 0)) goto LAB_0010827c;
              *pcVar11 = '/';
              pcVar11 = pcVar11 + 1;
            } while( true );
          }
        }
        uVar8 = 0;
LAB_0010827c:
        *(undefined8 *)((long)pPVar12 + -8) = 0x108288;
        __PHYSFS_platformReleaseMutex(stateLock);
        pcVar10 = local_40;
      }
      if (*(long *)(pcVar10 + -8) == 0) {
        return uVar8;
      }
      *(undefined8 *)((long)pPVar12 + -8) = 0x1082a0;
      (*__PHYSFS_AllocatorHooks.Free)(pcVar10 + -8);
      return uVar8;
    }
    puVar13 = (undefined8 *)((long)pPVar12 + -8);
    *(undefined8 *)((long)pPVar12 + -8) = 2;
  }
  uVar4 = *puVar13;
  *puVar13 = 0x10826a;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
  return 0;
}

Assistant:

int PHYSFS_mkdir(const char *_dname)
{
    int retval = 0;
    char *dname;
    size_t len;

    BAIL_IF(!_dname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_dname) + 1;
    dname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!dname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doMkdir(_dname, dname);
    __PHYSFS_smallFree(dname);
    return retval;
}